

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O3

int lzip_has_member(archive_read_filter *filter)

{
  int iVar1;
  int *piVar2;
  ssize_t avail;
  ssize_t sStack_8;
  
  piVar2 = (int *)__archive_read_filter_ahead(filter,6,&sStack_8);
  iVar1 = 0;
  if ((((piVar2 != (int *)0x0) && (iVar1 = 0, *piVar2 == 0x50495a4c)) && (*(byte *)(piVar2 + 1) < 2)
      ) && (iVar1 = 0x30, (byte)((*(byte *)((long)piVar2 + 5) & 0x1e) - 0x1e) < 0xee)) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
lzip_has_member(struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	int bits_checked;
	int log2dic;

	buffer = __archive_read_filter_ahead(filter, 6, &avail);
	if (buffer == NULL)
		return (0);

	/*
	 * Verify Header Magic Bytes : 4C 5A 49 50 (`LZIP')
	 */
	bits_checked = 0;
	if (memcmp(buffer, "LZIP", 4) != 0)
		return (0);
	bits_checked += 32;

	/* A version number must be 0 or 1 */
	if (buffer[4] != 0 && buffer[4] != 1)
		return (0);
	bits_checked += 8;

	/* Dictionary size. */
	log2dic = buffer[5] & 0x1f;
	if (log2dic < 12 || log2dic > 29)
		return (0);
	bits_checked += 8;

	return (bits_checked);
}